

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppUTestApprovals.h
# Opt level: O2

void __thiscall
ApprovalTests::ApprovalTestsCppUTestPlugin::preTestAction
          (ApprovalTestsCppUTestPlugin *this,UtestShell *shell,TestResult *result)

{
  unique_ptr<ApprovalTests::TestName,_std::default_delete<ApprovalTests::TestName>_> *this_00;
  TestName *pTVar1;
  pointer __p;
  SimpleString SVar2;
  undefined1 auStack_78 [16];
  string local_68;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  this_00 = &this->currentTest;
  __p = (pointer)operator_new(0x58,
                              "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/../ApprovalTests/integrations/cpputest/CppUTestApprovals.h"
                              ,0x31);
  (__p->sections).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->sections).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->sections).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__p->fileName)._M_dataplus._M_p = (pointer)&(__p->fileName).field_2;
  (__p->fileName)._M_string_length = 0;
  (__p->fileName).field_2._M_local_buf[0] = '\0';
  (__p->originalFileName)._M_dataplus._M_p = (pointer)&(__p->originalFileName).field_2;
  (__p->originalFileName)._M_string_length = 0;
  (__p->originalFileName).field_2._M_local_buf[0] = '\0';
  ::std::__uniq_ptr_impl<ApprovalTests::TestName,_std::default_delete<ApprovalTests::TestName>_>::
  reset((__uniq_ptr_impl<ApprovalTests::TestName,_std::default_delete<ApprovalTests::TestName>_> *)
        this_00,__p);
  pTVar1 = (this->currentTest)._M_t.
           super___uniq_ptr_impl<ApprovalTests::TestName,_std::default_delete<ApprovalTests::TestName>_>
           ._M_t.
           super__Tuple_impl<0UL,_ApprovalTests::TestName_*,_std::default_delete<ApprovalTests::TestName>_>
           .super__Head_base<0UL,_ApprovalTests::TestName_*,_false>._M_head_impl;
  SVar2 = UtestShell::getFile((UtestShell *)auStack_78);
  cppUTestToString_abi_cxx11_
            ((string *)(auStack_78 + 0x10),(ApprovalTestsCppUTestPlugin *)auStack_78,
             (SimpleString *)SVar2.bufferSize_);
  TestName::setFileName(pTVar1,(string *)(auStack_78 + 0x10));
  ::std::__cxx11::string::~string((string *)(auStack_78 + 0x10));
  SimpleString::~SimpleString((SimpleString *)auStack_78);
  pTVar1 = (this_00->_M_t).
           super___uniq_ptr_impl<ApprovalTests::TestName,_std::default_delete<ApprovalTests::TestName>_>
           ._M_t.
           super__Tuple_impl<0UL,_ApprovalTests::TestName_*,_std::default_delete<ApprovalTests::TestName>_>
           .super__Head_base<0UL,_ApprovalTests::TestName_*,_false>._M_head_impl;
  SVar2 = UtestShell::getGroup((UtestShell *)auStack_78);
  cppUTestToString_abi_cxx11_
            ((string *)(auStack_78 + 0x10),(ApprovalTestsCppUTestPlugin *)auStack_78,
             (SimpleString *)SVar2.bufferSize_);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pTVar1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (auStack_78 + 0x10));
  ::std::__cxx11::string::~string((string *)(auStack_78 + 0x10));
  SimpleString::~SimpleString((SimpleString *)auStack_78);
  pTVar1 = (this_00->_M_t).
           super___uniq_ptr_impl<ApprovalTests::TestName,_std::default_delete<ApprovalTests::TestName>_>
           ._M_t.
           super__Tuple_impl<0UL,_ApprovalTests::TestName_*,_std::default_delete<ApprovalTests::TestName>_>
           .super__Head_base<0UL,_ApprovalTests::TestName_*,_false>._M_head_impl;
  SVar2 = UtestShell::getName((UtestShell *)auStack_78);
  cppUTestToString_abi_cxx11_
            ((string *)(auStack_78 + 0x10),(ApprovalTestsCppUTestPlugin *)auStack_78,
             (SimpleString *)SVar2.bufferSize_);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pTVar1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (auStack_78 + 0x10));
  ::std::__cxx11::string::~string((string *)(auStack_78 + 0x10));
  SimpleString::~SimpleString((SimpleString *)auStack_78);
  FrameworkIntegrations::setCurrentTest
            ((this_00->_M_t).
             super___uniq_ptr_impl<ApprovalTests::TestName,_std::default_delete<ApprovalTests::TestName>_>
             ._M_t.
             super__Tuple_impl<0UL,_ApprovalTests::TestName_*,_std::default_delete<ApprovalTests::TestName>_>
             .super__Head_base<0UL,_ApprovalTests::TestName_*,_false>._M_head_impl);
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_30 = ::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/../ApprovalTests/integrations/cpputest/CppUTestApprovals.h:57:17)>
             ::_M_invoke;
  local_38 = ::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/../ApprovalTests/integrations/cpputest/CppUTestApprovals.h:57:17)>
             ::_M_manager;
  FrameworkIntegrations::setTestPassedNotification((TestPassedNotification *)&local_48);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_48);
  return;
}

Assistant:

void preTestAction(UtestShell& shell, TestResult& result) override
        {
            currentTest.reset(new ApprovalTests::TestName);
            currentTest->setFileName(cppUTestToString(shell.getFile()));

            currentTest->sections.emplace_back(cppUTestToString(shell.getGroup()));
            currentTest->sections.emplace_back(cppUTestToString(shell.getName()));

            ApprovalTests::FrameworkIntegrations::setCurrentTest(currentTest.get());
            ApprovalTests::FrameworkIntegrations::setTestPassedNotification(
                []() { CHECK_TRUE(true); });
            TestPlugin::preTestAction(shell, result);
        }